

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing-v5_16.c
# Opt level: O2

int can_calc_bittiming_v5_16(net_device *dev,can_bittiming *bt,can_bittiming_const *btc)

{
  uint uVar1;
  uint tseg;
  uint uVar2;
  __u32 _Var3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint tseg2;
  uint tseg1;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint sample_point_error;
  net_device *local_40;
  can_bittiming *local_38;
  
  tseg1 = 0;
  tseg2 = 0;
  local_68 = bt->sample_point;
  if (bt->sample_point == 0) {
    local_68 = 0x2ee;
    if (bt->bitrate < 0xc3501) {
      local_68 = 0x36b;
      if (500000 < bt->bitrate) {
        local_68 = 800;
      }
    }
  }
  uVar7 = (btc->tseg2_min + btc->tseg1_min) * 2;
  local_60 = 0;
  local_64 = 0;
  local_5c = 0xffffffff;
  uVar9 = 0xffffffff;
  local_50 = uVar7;
  local_40 = dev;
  local_38 = bt;
  for (uVar5 = (btc->tseg2_max + btc->tseg1_max) * 2 + 1; uVar8 = (uint)uVar9, uVar7 <= uVar5;
      uVar5 = uVar5 - 1) {
    tseg = uVar5 >> 1;
    uVar2 = (dev->priv).clock.freq;
    uVar1 = bt->bitrate;
    uVar10 = (uVar5 & 1) + uVar2 / (uVar1 * (tseg + 1));
    uVar10 = uVar10 - uVar10 % btc->brp_inc;
    if ((btc->brp_min <= uVar10) && (uVar10 <= btc->brp_max)) {
      uVar2 = uVar2 / ((tseg + 1) * uVar10);
      uVar4 = uVar1 - uVar2;
      uVar6 = -uVar4;
      if (0 < (int)uVar4) {
        uVar6 = uVar4;
      }
      if (uVar6 <= uVar8) {
        local_4c = uVar2;
        local_48 = uVar8;
        can_update_sample_point_v5_16(btc,local_68,tseg,&tseg1,&tseg2,&sample_point_error);
        uVar9 = (ulong)local_48;
        bt = local_38;
        dev = local_40;
        uVar7 = local_50;
        if (uVar6 < uVar8 || sample_point_error <= local_5c) {
          local_5c = sample_point_error;
          uVar9 = (ulong)uVar6;
          local_60 = uVar10;
          local_64 = tseg;
          if (uVar1 == local_4c && sample_point_error == 0) goto LAB_00102366;
        }
      }
    }
  }
  if ((uVar8 != 0) && (0x32 < (uint)((uVar9 * 1000) / (ulong)bt->bitrate))) {
    return -0x21;
  }
LAB_00102366:
  _Var3 = can_update_sample_point_v5_16(btc,local_68,local_64,&tseg1,&tseg2,(uint *)0x0);
  local_38->sample_point = _Var3;
  local_38->tq = (__u32)(((ulong)local_60 * 1000000000) / (ulong)(local_40->priv).clock.freq);
  local_38->prop_seg = tseg1 >> 1;
  local_38->phase_seg1 = tseg1 - (tseg1 >> 1);
  local_38->phase_seg2 = tseg2;
  uVar5 = local_38->sjw;
  uVar7 = 1;
  if ((uVar5 != 0) && (uVar8 = btc->sjw_max, uVar8 != 0)) {
    uVar2 = uVar8;
    if (uVar5 < uVar8) {
      uVar2 = uVar5;
    }
    uVar7 = uVar2;
    if (tseg2 < uVar2) {
      uVar7 = tseg2;
    }
    if (uVar5 <= uVar8 && tseg2 >= uVar2) goto LAB_001023f5;
  }
  local_38->sjw = uVar7;
LAB_001023f5:
  local_38->brp = local_60;
  local_38->bitrate = (local_40->priv).clock.freq / ((tseg1 + tseg2 + 1) * local_60);
  return 0;
}

Assistant:

int can_calc_bittiming(struct net_device *dev, struct can_bittiming *bt,
		       const struct can_bittiming_const *btc)
{
	struct can_priv *priv = netdev_priv(dev);
	unsigned int bitrate;			/* current bitrate */
	unsigned int bitrate_error;		/* difference between current and nominal value */
	unsigned int best_bitrate_error = UINT_MAX;
	unsigned int sample_point_error;	/* difference between current and nominal value */
	unsigned int best_sample_point_error = UINT_MAX;
	unsigned int sample_point_nominal;	/* nominal sample point */
	unsigned int best_tseg = 0;		/* current best value for tseg */
	unsigned int best_brp = 0;		/* current best value for brp */
	unsigned int brp, tsegall, tseg, tseg1 = 0, tseg2 = 0;
	u64 v64;

	/* Use CiA recommended sample points */
	if (bt->sample_point) {
		sample_point_nominal = bt->sample_point;
	} else {
		if (bt->bitrate > 800 * CAN_KBPS)
			sample_point_nominal = 750;
		else if (bt->bitrate > 500 * CAN_KBPS)
			sample_point_nominal = 800;
		else
			sample_point_nominal = 875;
	}

	/* tseg even = round down, odd = round up */
	for (tseg = (btc->tseg1_max + btc->tseg2_max) * 2 + 1;
	     tseg >= (btc->tseg1_min + btc->tseg2_min) * 2; tseg--) {
		tsegall = CAN_SYNC_SEG + tseg / 2;

		/* Compute all possible tseg choices (tseg=tseg1+tseg2) */
		brp = priv->clock.freq / (tsegall * bt->bitrate) + tseg % 2;

		/* choose brp step which is possible in system */
		brp = (brp / btc->brp_inc) * btc->brp_inc;
		if (brp < btc->brp_min || brp > btc->brp_max)
			continue;

		bitrate = priv->clock.freq / (brp * tsegall);
		bitrate_error = abs(bt->bitrate - bitrate);

		/* tseg brp biterror */
		if (bitrate_error > best_bitrate_error)
			continue;

		/* reset sample point error if we have a better bitrate */
		if (bitrate_error < best_bitrate_error)
			best_sample_point_error = UINT_MAX;

		can_update_sample_point(btc, sample_point_nominal, tseg / 2,
					&tseg1, &tseg2, &sample_point_error);
		if (sample_point_error > best_sample_point_error)
			continue;

		best_sample_point_error = sample_point_error;
		best_bitrate_error = bitrate_error;
		best_tseg = tseg / 2;
		best_brp = brp;

		if (bitrate_error == 0 && sample_point_error == 0)
			break;
	}

	if (best_bitrate_error) {
		/* Error in one-tenth of a percent */
		v64 = (u64)best_bitrate_error * 1000;
		do_div(v64, bt->bitrate);
		bitrate_error = (u32)v64;
		if (bitrate_error > CAN_CALC_MAX_ERROR) {
			netdev_err(dev,
				   "bitrate error %d.%d%% too high\n",
				   bitrate_error / 10, bitrate_error % 10);
			return -EDOM;
		}
		netdev_warn(dev, "bitrate error %d.%d%%\n",
			    bitrate_error / 10, bitrate_error % 10);
	}

	/* real sample point */
	bt->sample_point = can_update_sample_point(btc, sample_point_nominal,
						   best_tseg, &tseg1, &tseg2,
						   NULL);

	v64 = (u64)best_brp * 1000 * 1000 * 1000;
	do_div(v64, priv->clock.freq);
	bt->tq = (u32)v64;
	bt->prop_seg = tseg1 / 2;
	bt->phase_seg1 = tseg1 - bt->prop_seg;
	bt->phase_seg2 = tseg2;

	/* check for sjw user settings */
	if (!bt->sjw || !btc->sjw_max) {
		bt->sjw = 1;
	} else {
		/* bt->sjw is at least 1 -> sanitize upper bound to sjw_max */
		if (bt->sjw > btc->sjw_max)
			bt->sjw = btc->sjw_max;
		/* bt->sjw must not be higher than tseg2 */
		if (tseg2 < bt->sjw)
			bt->sjw = tseg2;
	}

	bt->brp = best_brp;

	/* real bitrate */
	bt->bitrate = priv->clock.freq /
		(bt->brp * (CAN_SYNC_SEG + tseg1 + tseg2));

	return 0;
}